

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

int __thiscall
absl::synchronization_internal::GraphCycles::FindPath
          (GraphCycles *this,GraphId idx,GraphId idy,int max_path_len,GraphId *path)

{
  int *piVar1;
  uint uVar2;
  int32_t v;
  Rep *pRVar3;
  Node **ppNVar4;
  Node *pNVar5;
  int *v_00;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int32_t w;
  int32_t x;
  NodeSet seen;
  int local_8c;
  int local_88;
  int local_84;
  Vec<int> *local_80;
  GraphCycles *local_78;
  GraphId *local_70;
  NodeSet local_68;
  
  pRVar3 = this->rep_;
  ppNVar4 = (pRVar3->nodes_).ptr_;
  local_84 = (int)idx.handle;
  pNVar5 = ppNVar4[idx.handle & 0xffffffff];
  iVar10 = 0;
  iVar11 = 0;
  if ((pNVar5 != (Node *)0x0) &&
     (iVar11 = iVar10, pNVar5->version == (uint32_t)(idx.handle >> 0x20))) {
    pNVar5 = ppNVar4[idy.handle & 0xffffffff];
    if ((pNVar5 != (Node *)0x0) && (pNVar5->version == (uint32_t)(idy.handle >> 0x20))) {
      local_88 = max_path_len;
      local_78 = this;
      local_70 = path;
      anon_unknown_0::NodeSet::NodeSet(&local_68);
      v_00 = (pRVar3->stack_).ptr_;
      piVar1 = (pRVar3->stack_).space_;
      if (v_00 != piVar1) {
        base_internal::LowLevelAlloc::Free(v_00);
      }
      local_80 = &pRVar3->stack_;
      (pRVar3->stack_).ptr_ = piVar1;
      (pRVar3->stack_).size_ = 0;
      (pRVar3->stack_).capacity_ = 8;
      anon_unknown_0::Vec<int>::push_back(local_80,&local_84);
      uVar7 = (pRVar3->stack_).size_;
      uVar8 = (ulong)uVar7;
      if (uVar7 != 0) {
        iVar11 = 0;
        do {
          uVar7 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar7;
          iVar10 = (pRVar3->stack_).ptr_[uVar8];
          uVar9 = (ulong)iVar10;
          (pRVar3->stack_).size_ = uVar7;
          if (-1 < (long)uVar9) {
            if (iVar11 < local_88) {
              local_70[iVar11].handle =
                   (ulong)(local_78->rep_->nodes_).ptr_[uVar9]->version << 0x20 | uVar9;
            }
            local_8c = -1;
            anon_unknown_0::Vec<int>::push_back(local_80,&local_8c);
            iVar11 = iVar11 + 1;
            if (iVar10 != (int)idy.handle) {
              uVar7 = 0;
              do {
                pNVar5 = (pRVar3->nodes_).ptr_[uVar9];
                uVar2 = (pNVar5->out).table_.size_;
                if (uVar2 < uVar7) {
                  uVar2 = uVar7;
                }
                lVar12 = 0;
                do {
                  if ((ulong)uVar2 - (ulong)uVar7 == lVar12) {
                    uVar8 = (ulong)(pRVar3->stack_).size_;
                    goto LAB_00146c6d;
                  }
                  v = (pNVar5->out).table_.ptr_[(ulong)uVar7 + lVar12];
                  lVar12 = lVar12 + 1;
                } while (v < 0);
                local_8c = v;
                bVar6 = anon_unknown_0::NodeSet::insert(&local_68,v);
                if (bVar6) {
                  anon_unknown_0::Vec<int>::push_back(local_80,&local_8c);
                }
                uVar7 = uVar7 + (int)lVar12;
              } while( true );
            }
            goto LAB_00146c78;
          }
          iVar11 = iVar11 + -1;
LAB_00146c6d:
        } while ((int)uVar8 != 0);
      }
      iVar11 = 0;
LAB_00146c78:
      anon_unknown_0::Vec<int>::~Vec(&local_68.table_);
    }
  }
  return iVar11;
}

Assistant:

int GraphCycles::FindPath(GraphId idx, GraphId idy, int max_path_len,
                          GraphId path[]) const {
  Rep* r = rep_;
  if (FindNode(r, idx) == nullptr || FindNode(r, idy) == nullptr) return 0;
  const int32_t x = NodeIndex(idx);
  const int32_t y = NodeIndex(idy);

  // Forward depth first search starting at x until we hit y.
  // As we descend into a node, we push it onto the path.
  // As we leave a node, we remove it from the path.
  int path_len = 0;

  NodeSet seen;
  r->stack_.clear();
  r->stack_.push_back(x);
  while (!r->stack_.empty()) {
    int32_t n = r->stack_.back();
    r->stack_.pop_back();
    if (n < 0) {
      // Marker to indicate that we are leaving a node
      path_len--;
      continue;
    }

    if (path_len < max_path_len) {
      path[path_len] = MakeId(n, rep_->nodes_[n]->version);
    }
    path_len++;
    r->stack_.push_back(-1);  // Will remove tentative path entry

    if (n == y) {
      return path_len;
    }

    HASH_FOR_EACH(w, r->nodes_[n]->out) {
      if (seen.insert(w)) {
        r->stack_.push_back(w);
      }
    }
  }

  return 0;
}